

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

ssl_verify_result_t bssl::ssl_verify_peer_cert(SSL_HANDSHAKE *hs)

{
  long lVar1;
  _func_bool_SSL_SESSION_ptr_SSL_HANDSHAKE_ptr_uint8_t_ptr *p_Var2;
  _func_int_SSL_ptr_void_ptr *p_Var3;
  CRYPTO_BUFFER *pCVar4;
  SSL_SESSION *pSVar5;
  bool bVar6;
  int iVar7;
  pointer psVar8;
  size_t sVar9;
  pointer psVar10;
  size_t sVar11;
  CRYPTO_BUFFER *pCVar12;
  uint8_t *puVar13;
  pointer psVar14;
  int desc;
  ssl_verify_result_t local_78;
  int cb_ret;
  ssl_verify_result_t ret;
  uint8_t alert;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_68;
  Span<const_unsigned_char> local_60;
  Span<const_unsigned_char> local_50;
  CRYPTO_BUFFER *local_40;
  CRYPTO_BUFFER *new_cert;
  CRYPTO_BUFFER *old_cert;
  size_t i;
  SSL_SESSION *prev_session;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  prev_session = (SSL_SESSION *)hs->ssl;
  ssl = (SSL *)hs;
  i = (size_t)std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                         (*(long *)((prev_session->secret).storage_ + 0x26) + 0x200));
  if ((pointer)i == (pointer)0x0) {
    cb_ret._3_1_ = 0x2e;
    if (((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->custom_verify_callback ==
        (_func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *)0x0) {
      psVar14 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                           ((prev_session->session_id).storage_ + 0x1d));
      p_Var2 = psVar14->x509_method->session_verify_cert_chain;
      psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                           &ssl[9].renegotiate_mode);
      bVar6 = (*p_Var2)(psVar10,(SSL_HANDSHAKE *)ssl,(uint8_t *)((long)&cb_ret + 3));
      local_78 = (ssl_verify_result_t)!bVar6;
    }
    else {
      local_78 = (*((ssl->config)._M_t.
                    super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                   custom_verify_callback)((SSL *)prev_session,(uint8_t *)((long)&cb_ret + 3));
      if (local_78 == ssl_verify_ok) {
        psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &ssl[9].renegotiate_mode);
        psVar10->verify_result = 0;
      }
      else if (local_78 == ssl_verify_invalid) {
        if (((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->verify_mode == '\0') {
          ERR_clear_error();
          local_78 = ssl_verify_ok;
        }
        psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &ssl[9].renegotiate_mode);
        psVar10->verify_result = 0x32;
      }
    }
    if (local_78 == ssl_verify_invalid) {
      ERR_put_error(0x10,0,0x7d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x128);
      ssl_send_alert((SSL *)prev_session,2,(uint)cb_ret._3_1_);
    }
    if ((((local_78 == ssl_verify_ok) && (((ulong)prev_session->x509_method & 0x100000000) == 0)) &&
        ((*(ushort *)
           &((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10d >> 2 & 1)
         != 0)) &&
       (psVar14 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                             ((prev_session->session_id).storage_ + 0x1d)),
       psVar14->legacy_ocsp_callback != (_func_int_SSL_ptr_void_ptr *)0x0)) {
      psVar14 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                           ((prev_session->session_id).storage_ + 0x1d));
      pSVar5 = prev_session;
      p_Var3 = psVar14->legacy_ocsp_callback;
      psVar14 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                           ((prev_session->session_id).storage_ + 0x1d));
      iVar7 = (*p_Var3)((SSL *)pSVar5,psVar14->legacy_ocsp_callback_arg);
      if (iVar7 < 1) {
        ERR_put_error(0x10,0,0x121,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0x134);
        desc = 0x50;
        if (iVar7 == 0) {
          desc = 0x71;
        }
        ssl_send_alert((SSL *)prev_session,2,desc);
        local_78 = ssl_verify_invalid;
      }
    }
    hs_local._4_4_ = local_78;
  }
  else {
    if (((*(byte *)((long)&prev_session->x509_method + 4) & 1 ^ 0xff) & 1) == 0) {
      __assert_fail("!ssl->server",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0xec,"enum ssl_verify_result_t bssl::ssl_verify_peer_cert(SSL_HANDSHAKE *)");
    }
    psVar8 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                       (&((pointer)i)->certs);
    sVar9 = sk_CRYPTO_BUFFER_num(psVar8);
    psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                         &ssl[9].renegotiate_mode);
    psVar8 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&psVar10->certs);
    sVar11 = sk_CRYPTO_BUFFER_num(psVar8);
    if (sVar9 == sVar11) {
      old_cert = (CRYPTO_BUFFER *)0x0;
      while( true ) {
        pCVar4 = old_cert;
        psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &ssl[9].renegotiate_mode);
        psVar8 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                           (&psVar10->certs);
        pCVar12 = (CRYPTO_BUFFER *)sk_CRYPTO_BUFFER_num(psVar8);
        if (pCVar12 <= pCVar4) break;
        psVar8 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                           ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                            (i + 0x98));
        new_cert = sk_CRYPTO_BUFFER_value(psVar8,(size_t)old_cert);
        psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &ssl[9].renegotiate_mode);
        psVar8 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                           (&psVar10->certs);
        local_40 = sk_CRYPTO_BUFFER_value(psVar8,(size_t)old_cert);
        puVar13 = CRYPTO_BUFFER_data(new_cert);
        sVar9 = CRYPTO_BUFFER_len(new_cert);
        Span<const_unsigned_char>::Span(&local_50,puVar13,sVar9);
        puVar13 = CRYPTO_BUFFER_data(local_40);
        sVar9 = CRYPTO_BUFFER_len(local_40);
        Span<const_unsigned_char>::Span(&local_60,puVar13,sVar9);
        bVar6 = internal::operator!=(local_50,local_60);
        if (bVar6) {
          ERR_put_error(0x10,0,0x111,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                        ,0xfc);
          ssl_send_alert((SSL *)prev_session,2,0x2f);
          return ssl_verify_invalid;
        }
        old_cert = (CRYPTO_BUFFER *)((long)&old_cert->pool + 1);
      }
      UpRef((bssl *)&local_68,(UniquePtr<CRYPTO_BUFFER> *)(i + 0x110));
      psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                           &ssl[9].renegotiate_mode);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=
                (&psVar10->ocsp_response,&local_68);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
      UpRef((bssl *)&ret,(UniquePtr<CRYPTO_BUFFER> *)(i + 0x108));
      psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                           &ssl[9].renegotiate_mode);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=
                (&psVar10->signed_cert_timestamp_list,
                 (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&ret);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&ret);
      lVar1 = *(long *)(i + 0xc0);
      psVar10 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                           &ssl[9].renegotiate_mode);
      psVar10->verify_result = lVar1;
      hs_local._4_4_ = ssl_verify_ok;
    }
    else {
      ERR_put_error(0x10,0,0x111,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0xef);
      ssl_send_alert((SSL *)prev_session,2,0x2f);
      hs_local._4_4_ = ssl_verify_invalid;
    }
  }
  return hs_local._4_4_;
}

Assistant:

enum ssl_verify_result_t ssl_verify_peer_cert(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  const SSL_SESSION *prev_session = ssl->s3->established_session.get();
  if (prev_session != NULL) {
    // If renegotiating, the server must not change the server certificate. See
    // https://mitls.org/pages/attacks/3SHAKE. We never resume on renegotiation,
    // so this check is sufficient to ensure the reported peer certificate never
    // changes on renegotiation.
    assert(!ssl->server);
    if (sk_CRYPTO_BUFFER_num(prev_session->certs.get()) !=
        sk_CRYPTO_BUFFER_num(hs->new_session->certs.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_CERT_CHANGED);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_verify_invalid;
    }

    for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(hs->new_session->certs.get());
         i++) {
      const CRYPTO_BUFFER *old_cert =
          sk_CRYPTO_BUFFER_value(prev_session->certs.get(), i);
      const CRYPTO_BUFFER *new_cert =
          sk_CRYPTO_BUFFER_value(hs->new_session->certs.get(), i);
      if (Span(CRYPTO_BUFFER_data(old_cert), CRYPTO_BUFFER_len(old_cert)) !=
          Span(CRYPTO_BUFFER_data(new_cert), CRYPTO_BUFFER_len(new_cert))) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_CERT_CHANGED);
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
        return ssl_verify_invalid;
      }
    }

    // The certificate is identical, so we may skip re-verifying the
    // certificate. Since we only authenticated the previous one, copy other
    // authentication from the established session and ignore what was newly
    // received.
    hs->new_session->ocsp_response = UpRef(prev_session->ocsp_response);
    hs->new_session->signed_cert_timestamp_list =
        UpRef(prev_session->signed_cert_timestamp_list);
    hs->new_session->verify_result = prev_session->verify_result;
    return ssl_verify_ok;
  }

  uint8_t alert = SSL_AD_CERTIFICATE_UNKNOWN;
  enum ssl_verify_result_t ret;
  if (hs->config->custom_verify_callback != nullptr) {
    ret = hs->config->custom_verify_callback(ssl, &alert);
    switch (ret) {
      case ssl_verify_ok:
        hs->new_session->verify_result = X509_V_OK;
        break;
      case ssl_verify_invalid:
        // If |SSL_VERIFY_NONE|, the error is non-fatal, but we keep the result.
        if (hs->config->verify_mode == SSL_VERIFY_NONE) {
          ERR_clear_error();
          ret = ssl_verify_ok;
        }
        hs->new_session->verify_result = X509_V_ERR_APPLICATION_VERIFICATION;
        break;
      case ssl_verify_retry:
        break;
    }
  } else {
    ret = ssl->ctx->x509_method->session_verify_cert_chain(
              hs->new_session.get(), hs, &alert)
              ? ssl_verify_ok
              : ssl_verify_invalid;
  }

  if (ret == ssl_verify_invalid) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CERTIFICATE_VERIFY_FAILED);
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
  }

  // Emulate OpenSSL's client OCSP callback. OpenSSL verifies certificates
  // before it receives the OCSP, so it needs a second callback for OCSP.
  if (ret == ssl_verify_ok && !ssl->server &&
      hs->config->ocsp_stapling_enabled &&
      ssl->ctx->legacy_ocsp_callback != nullptr) {
    int cb_ret =
        ssl->ctx->legacy_ocsp_callback(ssl, ssl->ctx->legacy_ocsp_callback_arg);
    if (cb_ret <= 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_OCSP_CB_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL,
                     cb_ret == 0 ? SSL_AD_BAD_CERTIFICATE_STATUS_RESPONSE
                                 : SSL_AD_INTERNAL_ERROR);
      ret = ssl_verify_invalid;
    }
  }

  return ret;
}